

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall
FuncBailOutData::Initialize(FuncBailOutData *this,Func *func,JitArenaAllocator *tempAllocator)

{
  JitArenaAllocator *this_00;
  JITTimeFunctionBody *this_01;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_02;
  int *piVar1;
  BVFixed *pBVar2;
  TrackAllocData local_50;
  RegSlot local_24;
  JitArenaAllocator *pJStack_20;
  RegSlot localsCount;
  JitArenaAllocator *tempAllocator_local;
  Func *func_local;
  FuncBailOutData *this_local;
  
  pJStack_20 = tempAllocator;
  tempAllocator_local = (JitArenaAllocator *)func;
  func_local = (Func *)this;
  this_01 = Func::GetJITFunctionBody(func);
  local_24 = JITTimeFunctionBody::GetLocalsCount(this_01);
  this_00 = pJStack_20;
  this->func = (Func *)tempAllocator_local;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&int::typeinfo,0,(ulong)local_24,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
             ,0x4fc);
  this_02 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           this_00,&local_50);
  piVar1 = Memory::AllocateArray<Memory::ArenaAllocator,int,false>
                     ((Memory *)this_02,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,0,
                      (ulong)local_24);
  this->localOffsets = piVar1;
  pBVar2 = BVFixed::New<Memory::JitArenaAllocator>(local_24,pJStack_20,false);
  this->losslessInt32Syms = pBVar2;
  pBVar2 = BVFixed::New<Memory::JitArenaAllocator>(local_24,pJStack_20,false);
  this->float64Syms = pBVar2;
  return;
}

Assistant:

void
FuncBailOutData::Initialize(Func * func, JitArenaAllocator * tempAllocator)
{
    Js::RegSlot localsCount = func->GetJITFunctionBody()->GetLocalsCount();
    this->func = func;
    this->localOffsets = AnewArrayZ(tempAllocator, int, localsCount);
    this->losslessInt32Syms = BVFixed::New(localsCount, tempAllocator);
    this->float64Syms = BVFixed::New(localsCount, tempAllocator);
}